

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  _Base_ptr *pp_Var1;
  cmExportSet *pcVar2;
  cmTargetExport *tei;
  cmGeneratorTarget *this_00;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  TargetType TVar6;
  PolicyStatus PVar7;
  int iVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  string *psVar11;
  char *pcVar12;
  uint uVar13;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *p_Var14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  pointer ppcVar18;
  uint uVar19;
  undefined8 uVar20;
  string *c;
  pointer pbVar21;
  bool bVar22;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar23;
  string expectedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  string sep;
  cmTargetExport *te;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostringstream e;
  string local_290;
  byte local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  uint local_23c;
  uint local_238;
  uint local_234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ostream *local_210;
  pointer local_208;
  cmTargetExport *local_200;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1f8;
  iterator iStack_1f0;
  cmTargetExport **local_1e8;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  string local_1d0;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1b0;
  undefined1 local_1a8 [16];
  _Base_ptr local_198;
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_1f8 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               *)0x0;
  iStack_1f0._M_current = (cmTargetExport **)0x0;
  local_1e8 = (cmTargetExport **)0x0;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  pcVar2 = this->IEGen->ExportSet;
  ppcVar18 = (pcVar2->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_208 = (pcVar2->TargetExports).
              super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  bVar22 = ppcVar18 == local_208;
  local_210 = os;
  if (!bVar22) {
    local_1d8 = &(this->super_cmExportFileGenerator).Namespace;
    local_1e0 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 *)&(this->super_cmExportFileGenerator).ExportedTargets;
    do {
      local_200 = *ppcVar18;
      std::operator+(&local_268,&local_230,local_1d8);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_1d0,local_200->Target);
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar20 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_268._M_string_length + local_1d0._M_string_length) {
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          uVar20 = local_1d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_268._M_string_length + local_1d0._M_string_length)
        goto LAB_0038fd6a;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_268._M_dataplus._M_p);
      }
      else {
LAB_0038fd6a:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_268,(ulong)local_1d0._M_dataplus._M_p);
      }
      pp_Var1 = (_Base_ptr *)(puVar9 + 2);
      if ((_Base_ptr *)*puVar9 == pp_Var1) {
        local_198 = *pp_Var1;
        p_Stack_190 = (_Base_ptr)puVar9[3];
        local_1a8._0_8_ = &local_198;
      }
      else {
        local_198 = *pp_Var1;
        local_1a8._0_8_ = (_Base_ptr *)*puVar9;
      }
      local_1a8._8_8_ = puVar9[1];
      *puVar9 = pp_Var1;
      puVar9[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::_M_append((char *)&local_290,local_1a8._0_8_);
      if ((_Base_ptr *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)((long)&local_198->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_230,0,(char *)local_230._M_string_length,0x4adeb1);
      pVar23 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>(local_1e0,&local_200->Target);
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"install(EXPORT \"",0x10);
        pcVar2 = this->IEGen->ExportSet;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pcVar2->Name)._M_dataplus._M_p,
                             (pcVar2->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" ...) ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"includes target \"",0x11);
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(local_200->Target);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"\" more than once in the export set.",0x23);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else if (iStack_1f0._M_current == local_1e8) {
        std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::
        _M_realloc_insert<cmTargetExport*const&>
                  ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&local_1f8,iStack_1f0,
                   &local_200);
      }
      else {
        *iStack_1f0._M_current = local_200;
        iStack_1f0._M_current = iStack_1f0._M_current + 1;
      }
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,
                          CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                   local_230.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00390633;
      }
      ppcVar18 = ppcVar18 + 1;
      bVar22 = ppcVar18 == local_208;
    } while (!bVar22);
  }
  poVar10 = local_210;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,local_210,&local_290)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                             local_290.field_2._M_local_buf[0]) + 1);
  }
  if (bVar22) {
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x13])(this);
    local_268._M_dataplus._M_p = (pointer)0x0;
    local_268._M_string_length = 0;
    local_268.field_2._M_allocated_capacity = 0;
    local_1b0 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 *)iStack_1f0._M_current;
    bVar22 = local_1f8 ==
             (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
              *)iStack_1f0._M_current;
    if (bVar22) {
      uVar17 = 0;
      uVar19 = 0;
      uVar15 = 0;
      uVar13 = 0;
    }
    else {
      local_23c = 0;
      local_234 = 0;
      local_238 = 0;
      local_208 = (pointer)((ulong)local_208 & 0xffffffff00000000);
      p_Var14 = local_1f8;
      do {
        tei = *(cmTargetExport **)p_Var14;
        this_00 = tei->Target;
        local_1e0 = p_Var14;
        TVar6 = cmGeneratorTarget::GetType(this_00);
        if (TVar6 == OBJECT_LIBRARY) {
          TVar6 = (uint)(tei->ObjectsGenerator == (cmInstallTargetGenerator *)0x0) * 3 +
                  OBJECT_LIBRARY;
        }
        local_269 = TVar6 != INTERFACE_LIBRARY;
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                  (this,local_210,this_00);
        local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(local_1d8._4_4_,TVar6);
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_198 = (_Base_ptr)0x0;
        p_Stack_190 = (_Base_ptr)(local_1a8 + 8);
        local_180 = 0;
        local_188 = p_Stack_190;
        cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                  (&this->super_cmExportFileGenerator,tei,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        cmExportFileGenerator::PopulateSourcesInterface
                  (&this->super_cmExportFileGenerator,tei,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        cmExportFileGenerator::PopulateLinkDirectoriesInterface
                  (&this->super_cmExportFileGenerator,tei,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        cmExportFileGenerator::PopulateLinkDependsInterface
                  (&this->super_cmExportFileGenerator,tei,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_268);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        local_290._M_string_length = 0;
        local_290.field_2._M_local_buf[0] = '\0';
        bVar4 = cmExportFileGenerator::PopulateExportProperties
                          (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8
                           ,&local_290);
        iVar8 = (int)local_1d8;
        if (bVar4) {
          PVar7 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
          if ((((PVar7 != WARN) &&
               (PVar7 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022), PVar7 != OLD)) &&
              (bVar5 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                                 (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                                  (ImportPropertyMap *)local_1a8,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_268), bVar5)) &&
             (local_23c = local_23c & 0xff, (this->super_cmExportFileGenerator).ExportOld == false))
          {
            local_23c = 1;
          }
          local_234 = local_234 & 0xff;
          if (iVar8 == 7) {
            local_234 = 1;
          }
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,"INTERFACE_SOURCES","");
          pcVar12 = cmGeneratorTarget::GetProperty(this_00,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                     local_230.field_2._M_local_buf[0]) + 1);
          }
          local_238 = local_238 & 0xff;
          if (pcVar12 != (char *)0x0) {
            local_238 = 1;
          }
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,"INTERFACE_POSITION_INDEPENDENT_CODE","");
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_230,this_00,
                     (ImportPropertyMap *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                     local_230.field_2._M_local_buf[0]) + 1);
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,this_00,local_210,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_1a8);
        }
        else {
          cmSystemTools::Error(&local_290);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_208 = (pointer)CONCAT44(local_208._4_4_,
                                      CONCAT31((int3)((ulong)local_208 >> 8),
                                               (byte)local_208 | local_269));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
        if (!bVar4) break;
        p_Var14 = local_1e0 + 8;
        bVar22 = p_Var14 == local_1b0;
      } while (!bVar22);
      poVar10 = local_210;
      uVar17 = (uint)local_208;
      uVar19 = local_238;
      uVar15 = local_234;
      uVar13 = local_23c;
    }
    if (bVar22) {
      if ((((byte)uVar19 | (byte)uVar15 | (byte)uVar13) & 1) != 0) {
        pcVar12 = "2.8.12";
        if ((uVar15 & 1) != 0) {
          pcVar12 = "3.0.0";
        }
        pcVar16 = "3.1.0";
        if ((uVar19 & 1) == 0) {
          pcVar16 = pcVar12;
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                  (this,poVar10,pcVar16);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x14])(this,poVar10);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(this,poVar10);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,poVar10);
      bVar22 = true;
      if ((uVar17 & 1) != 0) {
        pbVar21 = (this->super_cmExportFileGenerator).Configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (this->super_cmExportFileGenerator).Configurations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar21 != pbVar3) {
          bVar22 = true;
          do {
            iVar8 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
                              (this,pbVar21,&local_268);
            if ((char)iVar8 == '\0') {
              bVar22 = false;
            }
            pbVar21 = pbVar21 + 1;
            poVar10 = local_210;
          } while (pbVar21 != pbVar3);
        }
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
                (this,poVar10,&local_268);
    }
    else {
      bVar22 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_268);
  }
  else {
LAB_00390633:
    bVar22 = false;
  }
  if (local_1f8 !=
      (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
       *)0x0) {
    operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  return bVar22;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (cmTargetExport* te :
         *this->IEGen->GetExportSet()->GetTargetExports()) {
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te);
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);
    this->PopulateSourcesInterface(te, cmGeneratorExpression::InstallInterface,
                                   properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateLinkDirectoriesInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);
    this->PopulateLinkDependsInterface(
      te, cmGeneratorExpression::InstallInterface, properties, missingTargets);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties,
            missingTargets) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c, missingTargets)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}